

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O3

void fileToMsg(string *filename,Msg *msg)

{
  string s;
  string local_30;
  
  strcpy(msg->buf,(filename->_M_dataplus)._M_p);
  read_all_lines_one_abi_cxx11_(&local_30,(filename->_M_dataplus)._M_p);
  strcpy(msg->buf2,local_30._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void fileToMsg(String filename, Msg &msg){
    sprintf(msg.buf,"%s",filename.c_str());
    String s = read_all_lines_one(filename.c_str());
    sprintf(msg.buf2,"%s",s.c_str());
}